

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O3

bool __thiscall
xray_re::xr_ini_file::ini_section::line_exist(ini_section *this,char *lname,char **lvalue)

{
  pointer ppiVar1;
  ini_item *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  pointer ppiVar6;
  
  ppiVar6 = (this->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppiVar1 = (this->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)ppiVar1 - (long)ppiVar6 >> 3;
  while (uVar3 = uVar5, 0 < (long)uVar3) {
    uVar5 = uVar3 >> 1;
    iVar4 = strcasecmp((ppiVar6[uVar5]->name)._M_dataplus._M_p,lname);
    if (iVar4 < 0) {
      ppiVar6 = ppiVar6 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar3;
    }
  }
  if (ppiVar6 != ppiVar1) {
    piVar2 = *ppiVar6;
    iVar4 = strcasecmp((piVar2->name)._M_dataplus._M_p,lname);
    if (iVar4 == 0) {
      if (lvalue == (char **)0x0) {
        return true;
      }
      *lvalue = (piVar2->value)._M_dataplus._M_p;
      return true;
    }
  }
  return false;
}

Assistant:

bool xr_ini_file::ini_section::line_exist(const char* lname, const char** lvalue) const
{
	ini_item_vec_cit it = lower_bound_if(begin(), end(), ini_item_pred(lname));
	if (it == end() || xr_stricmp((*it)->name.c_str(), lname) != 0)
		return false;
	if (lvalue)
		*lvalue = (*it)->value.c_str();
	return true;
}